

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *pcVar4;
  reference pbVar5;
  bool local_3e1;
  bool local_352;
  allocator local_319;
  undefined1 local_318 [8];
  string impProp_2;
  string locProp_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  const_iterator aci;
  string local_298;
  allocator local_271;
  string local_270;
  char *local_250;
  char *iconfigs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  availableConfigs;
  string local_228;
  allocator local_201;
  undefined1 local_200 [8];
  string impProp_1;
  string locProp_1;
  undefined1 local_1b8 [8];
  string impProp;
  string locProp;
  string mcUpper;
  string local_150;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  const_iterator mci;
  undefined1 local_110 [6];
  bool allowImp;
  char *local_f0;
  char *mapValue;
  undefined1 local_e0 [8];
  string mapProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string locPropBase;
  string local_78;
  string local_58 [8];
  string config_upper;
  string *suffix_local;
  char **imp_local;
  char **loc_local;
  string *desired_config_local;
  cmTarget *this_local;
  
  config_upper.field_2._8_8_ = suffix;
  std::__cxx11::string::string(local_58);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_78,desired_config);
    std::__cxx11::string::operator=(local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::string
            ((string *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    std::__cxx11::string::operator=
              ((string *)
               &mappedConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"IMPORTED_LIBNAME");
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == OBJECT_LIBRARY) {
      std::__cxx11::string::operator=
                ((string *)
                 &mappedConfigs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"IMPORTED_OBJECTS");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 &mappedConfigs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"IMPORTED_LOCATION");
    }
  }
  std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,"_");
  std::__cxx11::string::operator+=((string *)config_upper.field_2._8_8_,local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&mapProp.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_e0,"MAP_IMPORTED_CONFIG_",(allocator *)((long)&mapValue + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&mapValue + 7));
  std::__cxx11::string::operator+=((string *)local_e0,local_58);
  pcVar4 = GetProperty(this,(string *)local_e0);
  local_f0 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_110,pcVar4,(allocator *)((long)&mci._M_current + 7));
    cmSystemTools::ExpandListArgument
              ((string *)local_110,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&mapProp.field_2 + 8),true);
    std::__cxx11::string::~string((string *)local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mci._M_current + 7));
  }
  std::__cxx11::string::~string((string *)local_e0);
  mci._M_current._6_1_ = HasImportLibrary(this);
  local_128._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&mapProp.field_2 + 8));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_120,&local_128);
  while( true ) {
    local_352 = false;
    if ((*loc == (char *)0x0) && (local_352 = false, *imp == (char *)0x0)) {
      local_130._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapProp.field_2 + 8));
      local_352 = __gnu_cxx::operator!=(&local_120,&local_130);
    }
    if (local_352 == false) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_120);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_120);
      cmsys::SystemTools::UpperCase((string *)((long)&locProp.field_2 + 8),pbVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&impProp.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mappedConfigs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"_");
      std::__cxx11::string::operator+=
                ((string *)(impProp.field_2._M_local_buf + 8),
                 (string *)(locProp.field_2._M_local_buf + 8));
      pcVar4 = GetProperty(this,(string *)((long)&impProp.field_2 + 8));
      *loc = pcVar4;
      if ((mci._M_current._6_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_1b8,"IMPORTED_IMPLIB_",
                   (allocator *)(locProp_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(locProp_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=
                  ((string *)local_1b8,(string *)(locProp.field_2._M_local_buf + 8));
        pcVar4 = GetProperty(this,(string *)local_1b8);
        *imp = pcVar4;
        std::__cxx11::string::~string((string *)local_1b8);
      }
      if ((*loc != (char *)0x0) || (*imp != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,"_");
        std::__cxx11::string::operator+=
                  ((string *)config_upper.field_2._8_8_,(string *)(locProp.field_2._M_local_buf + 8)
                  );
      }
      std::__cxx11::string::~string((string *)(impProp.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(locProp.field_2._M_local_buf + 8));
    }
    else {
      pcVar4 = GetProperty(this,(string *)
                                &mappedConfigs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *loc = pcVar4;
      if ((mci._M_current._6_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_150,"IMPORTED_IMPLIB",
                   (allocator *)(mcUpper.field_2._M_local_buf + 0xf));
        pcVar4 = GetProperty(this,&local_150);
        *imp = pcVar4;
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)(mcUpper.field_2._M_local_buf + 0xf));
      }
      if ((*loc != (char *)0x0) || (*imp != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,"");
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_120);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&mapProp.field_2 + 8));
  if (((bVar1) || (*loc != (char *)0x0)) || (*imp != (char *)0x0)) {
    if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
      std::__cxx11::string::string
                ((string *)(impProp_1.field_2._M_local_buf + 8),
                 (string *)
                 &mappedConfigs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=
                ((string *)(impProp_1.field_2._M_local_buf + 8),(string *)config_upper.field_2._8_8_
                );
      pcVar4 = GetProperty(this,(string *)((long)&impProp_1.field_2 + 8));
      *loc = pcVar4;
      if ((mci._M_current._6_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_200,"IMPORTED_IMPLIB",&local_201);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        std::__cxx11::string::operator+=((string *)local_200,(string *)config_upper.field_2._8_8_);
        pcVar4 = GetProperty(this,(string *)local_200);
        *imp = pcVar4;
        std::__cxx11::string::~string((string *)local_200);
      }
      std::__cxx11::string::~string((string *)(impProp_1.field_2._M_local_buf + 8));
    }
    if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
      std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,"");
      pcVar4 = GetProperty(this,(string *)
                                &mappedConfigs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *loc = pcVar4;
      if ((mci._M_current._6_1_ & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_228,"IMPORTED_IMPLIB",
                   (allocator *)
                   ((long)&availableConfigs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pcVar4 = GetProperty(this,&local_228);
        *imp = pcVar4;
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&availableConfigs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
    }
    if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iconfigs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"IMPORTED_CONFIGURATIONS",&local_271);
      pcVar4 = GetProperty(this,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      local_250 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_298,pcVar4,(allocator *)((long)&aci._M_current + 7));
        cmSystemTools::ExpandListArgument
                  (&local_298,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&iconfigs,false);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator((allocator<char> *)((long)&aci._M_current + 7));
      }
      local_2b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&iconfigs);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_2a8,&local_2b0);
      while( true ) {
        local_3e1 = false;
        if ((*loc == (char *)0x0) && (local_3e1 = false, *imp == (char *)0x0)) {
          local_2b8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&iconfigs);
          local_3e1 = __gnu_cxx::operator!=(&local_2a8,&local_2b8);
        }
        if (local_3e1 == false) break;
        std::__cxx11::string::operator=((string *)config_upper.field_2._8_8_,"_");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2a8);
        cmsys::SystemTools::UpperCase((string *)((long)&locProp_2.field_2 + 8),pbVar5);
        std::__cxx11::string::operator+=
                  ((string *)config_upper.field_2._8_8_,
                   (string *)(locProp_2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(locProp_2.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)(impProp_2.field_2._M_local_buf + 8),
                   (string *)
                   &mappedConfigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=
                  ((string *)(impProp_2.field_2._M_local_buf + 8),
                   (string *)config_upper.field_2._8_8_);
        pcVar4 = GetProperty(this,(string *)((long)&impProp_2.field_2 + 8));
        *loc = pcVar4;
        if ((mci._M_current._6_1_ & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_318,"IMPORTED_IMPLIB",&local_319);
          std::allocator<char>::~allocator((allocator<char> *)&local_319);
          std::__cxx11::string::operator+=((string *)local_318,(string *)config_upper.field_2._8_8_)
          ;
          pcVar4 = GetProperty(this,(string *)local_318);
          *imp = pcVar4;
          std::__cxx11::string::~string((string *)local_318);
        }
        std::__cxx11::string::~string((string *)(impProp_2.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iconfigs);
    }
    if ((*loc == (char *)0x0) && (*imp == (char *)0x0)) {
      TVar2 = GetType(this);
      this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    TVar2 = GetType(this);
    this_local._7_1_ = TVar2 == INTERFACE_LIBRARY;
  }
  locProp_1.field_2._8_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&mapProp.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc, const char** imp,
                               std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += config_upper;

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = "MAP_IMPORTED_CONFIG_";
    mapProp += config_upper;
    if (const char* mapValue = this->GetProperty(mapProp)) {
      cmSystemTools::ExpandListArgument(mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for (std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
       !*loc && !*imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      *loc = this->GetProperty(locPropBase);
      if (allowImp) {
        *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (*loc || *imp) {
        suffix = "";
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = locPropBase + "_";
      locProp += mcUpper;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB_";
        impProp += mcUpper;
        *imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (*loc || *imp) {
        suffix = "_";
        suffix += mcUpper;
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!*loc && !*imp) {
    std::string locProp = locPropBase;
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!*loc && !*imp) {
    // The suffix computed above is not useful.
    suffix = "";

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty(locPropBase);
    if (allowImp) {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!*loc && !*imp) {
    std::vector<std::string> availableConfigs;
    if (const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
    }
    for (std::vector<std::string>::const_iterator aci =
           availableConfigs.begin();
         !*loc && !*imp && aci != availableConfigs.end(); ++aci) {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = locPropBase;
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}